

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O2

size_t arith_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  size_type __n;
  byte *pbVar1;
  size_t maxv;
  ulong uVar2;
  size_t sVar3;
  size_t sVar4;
  ulong uVar5;
  ostream *poVar6;
  ulong uVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int silent;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  uint uVar16;
  allocator_type local_79;
  size_t local_78;
  uint32_t *local_70;
  size_t local_68;
  size_t local_60;
  value_type local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  size_t local_38;
  
  local_70 = obuff;
  local_68 = osize;
  sVar3 = byte_decode(ibuff,osize,0x80000000,&local_38);
  maxv = local_38;
  sVar4 = byte_decode(ibuff + sVar3,osize,0x80000000,&local_38);
  lVar14 = sVar4 + sVar3;
  __n = maxv + 1;
  local_54 = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&F,__n,&local_54,&local_79);
  if (local_38 < 1000) {
    sVar3 = interp_decompress(F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,__n,ibuff + lVar14,
                              isize - lVar14);
    silent = extraout_EDX;
  }
  else {
    sVar3 = arith_decompress(F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                             _M_impl.super__Vector_impl_data._M_start,__n,ibuff + lVar14,
                             isize - lVar14);
    silent = extraout_EDX_00;
  }
  scale_counts(&F,maxv,silent);
  *F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data
   ._M_start = 0;
  for (sVar4 = 0; maxv != sVar4; sVar4 = sVar4 + 1) {
    F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start[sVar4 + 1] =
         F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[sVar4 + 1] +
         F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start[sVar4];
  }
  uVar7 = 0;
  for (lVar8 = 0; (int)lVar8 != 7; lVar8 = lVar8 + 1) {
    uVar7 = uVar7 << 8 | (ulong)ibuff[lVar8 + sVar3 + lVar14];
  }
  uVar10 = sVar3 + lVar14 + 7;
  uVar13 = 0;
  local_78 = maxv;
  uVar11 = 0xffffffffffffff;
  sVar3 = 0;
  do {
    if (sVar3 == local_68) {
      std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                (&F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
      return uVar10;
    }
    uVar15 = uVar11 >> 0x1f;
    uVar5 = uVar7 / uVar15;
    if (0x7ffffffe < uVar5) {
      uVar5 = 0x7fffffff;
    }
    uVar9 = maxv & 0xffffffff;
    uVar16 = 0;
    do {
      uVar2 = uVar9;
      do {
        uVar9 = uVar2;
        if ((int)uVar9 <= (int)uVar16) goto LAB_00139e29;
        uVar12 = uVar16 + 1 + (int)uVar9 >> 1;
        uVar13 = (ulong)uVar12;
        uVar2 = (ulong)uVar12;
      } while (uVar5 < F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13 - 1]);
      uVar16 = uVar12;
    } while (F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar13] <= (uint)uVar5);
LAB_00139e29:
    local_70[sVar3] = (int)uVar13 - 1;
    lVar14 = uVar15 * F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13 - 1];
    uVar7 = uVar7 - lVar14;
    uVar11 = uVar11 - lVar14;
    if (-1 < (int)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13]) {
      uVar11 = ((ulong)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar13] -
               (ulong)F.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar13 - 1]) * uVar15;
    }
    for (; local_60 = sVar3, uVar11 >> 0x30 == 0; uVar11 = uVar11 << 8) {
      if (isize <= uVar10) {
        poVar6 = std::operator<<((ostream *)&std::cerr,"I/O error");
        std::endl<char,std::char_traits<char>>(poVar6);
        exit(1);
      }
      pbVar1 = ibuff + uVar10;
      uVar10 = uVar10 + 1;
      uVar7 = (uVar7 & 0xffffffffffff) << 8 | (ulong)*pbVar1;
    }
    sVar3 = sVar3 + 1;
  } while( true );
}

Assistant:

size_t arith_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */

    int i;
    size_t op, ip = 0;

    /* state variables for decoding */
    uint64_t R = FULL;
    uint64_t D;
    uint64_t low, high, total, scale;
    uint64_t target;
    uint64_t v = 0;
    size_t maxv;
    size_t nunq;

    /* fetch the prelude */
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    maxv = target;
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    nunq = target;

    std::vector<uint32_t> F(maxv + 1, 0);

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        ip += interp_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    } else {
        /* or else, tadaa, recursive call for prelude... */
        ip += arith_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    }

    /* adjust and scale the counts like the encoder did */
    total = scale_counts(F, maxv, 1);

    /* convert to cumulative sums */
    F[0] = 0;
    for (i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* load up D */
    D = 0;
    for (i = 0; i < BBYTES; i++) {
        D <<= 8;
        D += ibuff[ip++];
    }

    /* and decode the required symbols one by one */
    for (op = 0; op < osize; op++) {
        /* decode target */
        scale = R >> TBTS;
        target = D / scale;

        /* beware of the rounding that might accrue at the top of the
                   range, and adjust downward if required */
        if (target >= total)
            target = total - 1;
        /* binary search in F for target is a little faster */
        {
            int lo = 0, hi = maxv;
            /* elements F[lo..hi] inclusive being considered */
            while (lo < hi) {
                v = (1 + lo + hi) >> 1;
                if (F[v - 1] > target) {
                    hi = v;
                } else if (target >= F[v]) {
                    lo = v;
                } else {
                    break;
                }
            }
        }

        /* (could also take leading bits of target to index a table
                   and accelerate the search, leave that for another day)
                */
        obuff[op] = v - 1;

        /* adjust, tracing the encoder, with D=V-L throughout */
        low = F[v - 1];
        high = F[v];
        D -= low * scale;
        if (high < total) {
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        while (R < PART) {
            if (ip >= isize) {
                std::cerr << "I/O error" << std::endl;
                exit(EXIT_FAILURE);
            }
            /* range has shrunk, time to bring in another byte */
            R <<= 8;
            D <<= 8;
            D &= FULL;
            D += ibuff[ip++];
        }
    }
    return ip;
}